

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O0

pair<const_void_*const_*,_bool> __thiscall
llvm::SmallPtrSetImplBase::insert_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  uint uVar1;
  void **ppvVar2;
  bool bVar3;
  void **ppvVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  pair<const_void_**,_bool> pVar5;
  pair<const_void_*const_*,_bool> pVar6;
  pair<const_void_*const_*,_bool> pVar7;
  bool local_b1;
  void **local_b0;
  pair<const_void_**,_bool> local_a8;
  void **local_98;
  undefined1 local_90;
  bool local_81;
  pair<const_void_**,_bool> local_80;
  void **local_70;
  undefined1 local_68;
  bool local_59;
  pair<const_void_**,_bool> local_58;
  void **local_48;
  void *Value;
  void **E;
  void **APtr;
  void **LastTombstone;
  void *Ptr_local;
  SmallPtrSetImplBase *this_local;
  bool local_10;
  
  LastTombstone = (void **)Ptr;
  Ptr_local = this;
  bVar3 = isSmall(this);
  if (bVar3) {
    APtr = (void **)0x0;
    Value = this->SmallArray + this->NumNonEmpty;
    for (E = this->SmallArray; E != (void **)Value; E = E + 1) {
      ppvVar2 = (void **)*E;
      local_48 = ppvVar2;
      if (ppvVar2 == LastTombstone) {
        local_59 = false;
        pVar5 = std::make_pair<void_const**&,bool>(&E,&local_59);
        local_70 = pVar5.first;
        local_68 = pVar5.second;
        local_58.first = local_70;
        local_58.second = (bool)local_68;
        std::pair<const_void_*const_*,_bool>::pair<const_void_**,_bool,_true>
                  ((pair<const_void_*const_*,_bool> *)&this_local,&local_58);
        pVar6._8_8_ = extraout_RDX;
        pVar6.first = &this_local->SmallArray;
        goto LAB_001ec756;
      }
      ppvVar4 = (void **)getTombstoneMarker();
      if (ppvVar2 == ppvVar4) {
        APtr = E;
      }
    }
    if (APtr != (void **)0x0) {
      *APtr = LastTombstone;
      this->NumTombstones = this->NumTombstones - 1;
      DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
      local_81 = true;
      pVar5 = std::make_pair<void_const**&,bool>(&APtr,&local_81);
      local_98 = pVar5.first;
      local_90 = pVar5.second;
      local_80.first = local_98;
      local_80.second = (bool)local_90;
      std::pair<const_void_*const_*,_bool>::pair<const_void_**,_bool,_true>
                ((pair<const_void_*const_*,_bool> *)&this_local,&local_80);
      pVar6._8_8_ = extraout_RDX_00;
      pVar6.first = &this_local->SmallArray;
      goto LAB_001ec756;
    }
    if (this->NumNonEmpty < this->CurArraySize) {
      uVar1 = this->NumNonEmpty;
      this->NumNonEmpty = uVar1 + 1;
      this->SmallArray[uVar1] = LastTombstone;
      DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
      local_b0 = this->SmallArray + (this->NumNonEmpty - 1);
      local_b1 = true;
      pVar5 = std::make_pair<void_const**,bool>(&local_b0,&local_b1);
      local_a8.first = pVar5.first;
      local_a8.second = pVar5.second;
      std::pair<const_void_*const_*,_bool>::pair<const_void_**,_bool,_true>
                ((pair<const_void_*const_*,_bool> *)&this_local,&local_a8);
      pVar6._8_8_ = extraout_RDX_01;
      pVar6.first = &this_local->SmallArray;
      goto LAB_001ec756;
    }
  }
  pVar6 = insert_imp_big(this,LastTombstone);
  local_10 = pVar6.second;
LAB_001ec756:
  this_local = (SmallPtrSetImplBase *)pVar6.first;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first = (void **)this_local;
  return pVar7;
}

Assistant:

std::pair<const void *const *, bool> insert_imp(const void *Ptr) {
    if (isSmall()) {
      // Check to see if it is already in the set.
      const void **LastTombstone = nullptr;
      for (const void **APtr = SmallArray, **E = SmallArray + NumNonEmpty;
           APtr != E; ++APtr) {
        const void *Value = *APtr;
        if (Value == Ptr)
          return std::make_pair(APtr, false);
        if (Value == getTombstoneMarker())
          LastTombstone = APtr;
      }

      // Did we find any tombstone marker?
      if (LastTombstone != nullptr) {
        *LastTombstone = Ptr;
        --NumTombstones;
        incrementEpoch();
        return std::make_pair(LastTombstone, true);
      }

      // Nope, there isn't.  If we stay small, just 'pushback' now.
      if (NumNonEmpty < CurArraySize) {
        SmallArray[NumNonEmpty++] = Ptr;
        incrementEpoch();
        return std::make_pair(SmallArray + (NumNonEmpty - 1), true);
      }
      // Otherwise, hit the big set case, which will call grow.
    }
    return insert_imp_big(Ptr);
  }